

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

Ivy_Obj_t * Ivy_ManDsdConstruct(Ivy_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vTree)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  undefined4 local_28;
  int i;
  int Entry;
  Vec_Int_t *vTree_local;
  Vec_Int_t *vFront_local;
  Ivy_Man_t *p_local;
  
  for (local_28 = 0; iVar1 = Vec_IntSize(vFront), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(vFront,local_28);
    iVar1 = Ivy_LeafId(iVar1);
    Vec_IntWriteEntry(vFront,local_28,iVar1);
  }
  iVar1 = Vec_IntSize(vTree);
  pIVar2 = Ivy_ManDsdConstruct_rec(p,vFront,iVar1 + -1,vTree);
  return pIVar2;
}

Assistant:

Ivy_Obj_t * Ivy_ManDsdConstruct( Ivy_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vTree )
{
    int Entry, i;
    // implement latches on the frontier (TEMPORARY!!!)
    Vec_IntForEachEntry( vFront, Entry, i )
        Vec_IntWriteEntry( vFront, i, Ivy_LeafId(Entry) );
    // recursively construct the tree
    return Ivy_ManDsdConstruct_rec( p, vFront, Vec_IntSize(vTree)-1, vTree );
}